

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

void __thiscall netbase_tests::caddress_serialize_v1::test_method(caddress_serialize_v1 *this)

{
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> s;
  const_string msg;
  char *local_a8;
  char *local_a0;
  ParamsWrapper<CAddress::SerParams,_const_std::vector<CAddress,_std::allocator<CAddress>_>_>
  local_98;
  undefined1 *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  DataStream local_58;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_read_pos = 0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_params = &CAddress::V1_NETWORK;
  local_98.m_object = (vector<CAddress,_std::allocator<CAddress>_> *)fixture_addresses;
  ParamsWrapper<CAddress::SerParams,_const_std::vector<CAddress,_std::allocator<CAddress>_>_>::
  Serialize<DataStream>(&local_98,&local_58);
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x237;
  file.m_begin = (iterator)&local_68;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  local_98.m_object =
       (vector<CAddress,_std::allocator<CAddress>_> *)
       ((ulong)local_98.m_object & 0xffffffffffffff00);
  local_98.m_params = (SerParams *)&PTR__lazy_ostream_011480b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a0 = "";
  s.m_data = local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + local_58.m_read_pos;
  s.m_size = (long)local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)s.m_data;
  HexStr_abi_cxx11_(&local_38,s);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char_const*>
            (&local_98,&local_a8,0x237,1,2,&local_38,"HexStr(s)",&stream_addrv1_hex,
             "stream_addrv1_hex");
  std::__cxx11::string::~string((string *)&local_38);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddress_serialize_v1)
{
    DataStream s{};

    s << CAddress::V1_NETWORK(fixture_addresses);
    BOOST_CHECK_EQUAL(HexStr(s), stream_addrv1_hex);
}